

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_fill_number(lyxp_set *set,longdouble number)

{
  longdouble number_local;
  lyxp_set *set_local;
  
  if (set->type == LYXP_SET_NODE_SET) {
    free((set->val).nodes);
  }
  else if (set->type == LYXP_SET_STRING) {
    free((set->val).nodes);
  }
  set->type = LYXP_SET_NUMBER;
  (set->val).num = number;
  return;
}

Assistant:

static void
set_fill_number(struct lyxp_set *set, long double number)
{
    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }

    set->type = LYXP_SET_NUMBER;
    set->val.num = number;
}